

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi,int q_orig)

{
  uint uVar1;
  uint uVar2;
  uint min_qmlevel;
  int iVar3;
  uint enable_hdr_deltaq;
  YV12_BUFFER_CONFIG *pYVar4;
  int in_ESI;
  AV1_COMP *in_RDI;
  int pass;
  BLOCK_SIZE fixed_partition_block_size_orig;
  int partition_search_type_orig;
  int q_for_screen_content_quick_run;
  int is_screen_content_type_orig_decision;
  int use_screen_content_tools_orig_decision;
  int allow_intrabc_orig_decision;
  int allow_screen_content_tools_orig_decision;
  int is_key_frame;
  PSNR_STATS psnr [3];
  int projected_size_pass [3];
  QuantizationCfg *q_cfg;
  AV1EncoderConfig *oxcf;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int sharpness;
  aom_bit_depth_t bit_depth;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar5;
  int q;
  int max_qmlevel;
  AV1_COMP *in_stack_fffffffffffffdf0;
  aom_tune_metric in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined1 in_stack_fffffffffffffe05;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  int in_stack_fffffffffffffe08;
  InterpFilter in_stack_fffffffffffffe0f;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe10;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe18;
  AV1_COMMON *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe7c;
  AV1_COMP *in_stack_fffffffffffffe80;
  undefined1 local_34 [12];
  QuantizationCfg *local_28;
  AV1EncoderConfig *local_20;
  AV1_COMMON *local_18;
  int local_c;
  AV1_COMP *local_8;
  
  local_18 = &in_RDI->common;
  local_20 = &in_RDI->oxcf;
  local_28 = &(in_RDI->oxcf).q_cfg;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_34,0,0xc);
  uVar1 = (uint)((local_18->current_frame).frame_type == '\0');
  uVar2 = (uint)((local_18->features).allow_screen_content_tools & 1);
  min_qmlevel = (uint)((local_18->features).allow_intrabc & 1);
  max_qmlevel = local_8->use_screen_content_tools;
  q = local_8->is_screen_content_type;
  if ((((((local_8->sf).rt_sf.use_nonrd_pick_mode == 0) &&
        (((local_20->kf_cfg).fwd_kf_enabled & 1U) == 0)) &&
       (local_8->superres_mode == AOM_SUPERRES_NONE)) &&
      ((local_20->mode != '\x01' && (max_qmlevel == 0)))) && (uVar1 != 0)) {
    iVar3 = is_lossless_requested(&local_20->rc_cfg);
    sharpness = local_c;
    if ((iVar3 == 0) && (in_stack_fffffffffffffdbc = local_c, local_c < 0xf5)) {
      in_stack_fffffffffffffdbc = 0xf4;
      sharpness = 0xf4;
    }
    enable_hdr_deltaq = (uint)(local_8->sf).part_sf.partition_search_type;
    uVar5 = CONCAT13((local_8->sf).part_sf.fixed_partition_size,(int3)in_stack_fffffffffffffdc8);
    iVar3 = sharpness;
    pYVar4 = av1_realloc_and_scale_if_required
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f,
                        in_stack_fffffffffffffe08,(_Bool)in_stack_fffffffffffffe07,
                        (_Bool)in_stack_fffffffffffffe06,in_stack_fffffffffffffe48,
                        (_Bool)in_stack_fffffffffffffe05);
    local_8->source = pYVar4;
    if (local_8->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar4 = av1_realloc_and_scale_if_required
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f,
                          in_stack_fffffffffffffe08,(_Bool)in_stack_fffffffffffffe07,
                          (_Bool)in_stack_fffffffffffffe06,in_stack_fffffffffffffe48,
                          (_Bool)in_stack_fffffffffffffe05);
      local_8->last_source = pYVar4;
    }
    av1_setup_frame(in_stack_fffffffffffffdb0);
    if ((local_18->seg).enabled == '\0') {
      memset(&local_18->seg,0,0xac);
    }
    else if (((local_18->seg).update_data == '\0') && (local_18->prev_frame != (RefCntBuffer *)0x0))
    {
      segfeatures_copy(&local_18->seg,&local_18->prev_frame->seg);
      (local_18->seg).enabled = (local_18->prev_frame->seg).enabled;
    }
    else {
      av1_calculate_segdata(&local_18->seg);
    }
    segfeatures_copy(&local_18->cur_frame->seg,&local_18->seg);
    (local_18->cur_frame->seg).enabled = (local_18->seg).enabled;
    for (bit_depth = 0; (int)bit_depth < 2; bit_depth = bit_depth + 1) {
      set_encoding_params_for_screen_content(local_8,bit_depth);
      av1_set_quantizer((AV1_COMMON *)CONCAT44(uVar1,uVar2),min_qmlevel,max_qmlevel,q,iVar3,
                        enable_hdr_deltaq,SUB41((uint)uVar5 >> 0x18,0),in_stack_fffffffffffffdf8);
      av1_set_speed_features_qindex_dependent(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      av1_init_quantizer((EncQuantDequantParams *)CONCAT44(q,iVar3),
                         (CommonQuantParams *)CONCAT44(enable_hdr_deltaq,uVar5),bit_depth,sharpness)
      ;
      av1_set_variance_partition_thresholds
                ((AV1_COMP *)CONCAT44(bit_depth,sharpness),in_stack_fffffffffffffdbc,
                 in_stack_fffffffffffffdb8);
      av1_encode_frame(in_stack_fffffffffffffdf0);
      screen_content_tools_determination
                ((AV1_COMP *)CONCAT44(uVar1,uVar2),min_qmlevel,max_qmlevel,q,iVar3,enable_hdr_deltaq
                 ,(int *)in_stack_fffffffffffffdf0,
                 (PSNR_STATS *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    (local_8->sf).part_sf.partition_search_type = (PARTITION_SEARCH_TYPE)enable_hdr_deltaq;
    (local_8->sf).part_sf.fixed_partition_size = (BLOCK_SIZE)((uint)uVar5 >> 0x18);
    if (((local_18->features).allow_screen_content_tools & 1U) == 0) {
      free_token_info((TokenInfo *)0x24e5a4);
    }
  }
  return;
}

Assistant:

void av1_determine_sc_tools_with_encoding(AV1_COMP *cpi, const int q_orig) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const QuantizationCfg *const q_cfg = &oxcf->q_cfg;
  // Variables to help determine if we should allow screen content tools.
  int projected_size_pass[3] = { 0 };
  PSNR_STATS psnr[3];
  const int is_key_frame = cm->current_frame.frame_type == KEY_FRAME;
  const int allow_screen_content_tools_orig_decision =
      cm->features.allow_screen_content_tools;
  const int allow_intrabc_orig_decision = cm->features.allow_intrabc;
  const int use_screen_content_tools_orig_decision =
      cpi->use_screen_content_tools;
  const int is_screen_content_type_orig_decision = cpi->is_screen_content_type;
  // Turn off the encoding trial for forward key frame and superres.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode || oxcf->kf_cfg.fwd_kf_enabled ||
      cpi->superres_mode != AOM_SUPERRES_NONE || oxcf->mode == REALTIME ||
      use_screen_content_tools_orig_decision || !is_key_frame) {
    return;
  }

  // TODO(chengchen): multiple encoding for the lossless mode is time consuming.
  // Find a better way to determine whether screen content tools should be used
  // for lossless coding.
  // Use a high q and a fixed partition to do quick encoding.
  const int q_for_screen_content_quick_run =
      is_lossless_requested(&oxcf->rc_cfg) ? q_orig : AOMMAX(q_orig, 244);
  const int partition_search_type_orig = cpi->sf.part_sf.partition_search_type;
  const BLOCK_SIZE fixed_partition_block_size_orig =
      cpi->sf.part_sf.fixed_partition_size;

  // Setup necessary params for encoding, including frame source, etc.

  cpi->source = av1_realloc_and_scale_if_required(
      cm, cpi->unscaled_source, &cpi->scaled_source, cm->features.interp_filter,
      0, false, false, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);
  if (cpi->unscaled_last_source != NULL) {
    cpi->last_source = av1_realloc_and_scale_if_required(
        cm, cpi->unscaled_last_source, &cpi->scaled_last_source,
        cm->features.interp_filter, 0, false, false, cpi->oxcf.border_in_pixels,
        cpi->alloc_pyramid);
  }

  av1_setup_frame(cpi);

  if (cm->seg.enabled) {
    if (!cm->seg.update_data && cm->prev_frame) {
      segfeatures_copy(&cm->seg, &cm->prev_frame->seg);
      cm->seg.enabled = cm->prev_frame->seg.enabled;
    } else {
      av1_calculate_segdata(&cm->seg);
    }
  } else {
    memset(&cm->seg, 0, sizeof(cm->seg));
  }
  segfeatures_copy(&cm->cur_frame->seg, &cm->seg);
  cm->cur_frame->seg.enabled = cm->seg.enabled;

  // The two encoding passes aim to help determine whether to use screen
  // content tools, with a high q and fixed partition.
  for (int pass = 0; pass < 2; ++pass) {
    set_encoding_params_for_screen_content(cpi, pass);
    av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel,
                      q_for_screen_content_quick_run,
                      q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                      oxcf->mode == ALLINTRA, oxcf->tune_cfg.tuning);
    av1_set_speed_features_qindex_dependent(cpi, oxcf->speed);

    av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                       cm->seq_params->bit_depth, oxcf->algo_cfg.sharpness);

    av1_set_variance_partition_thresholds(cpi, q_for_screen_content_quick_run,
                                          0);
    // transform / motion compensation build reconstruction frame
    av1_encode_frame(cpi);
    // Screen content decision
    screen_content_tools_determination(
        cpi, allow_screen_content_tools_orig_decision,
        allow_intrabc_orig_decision, use_screen_content_tools_orig_decision,
        is_screen_content_type_orig_decision, pass, projected_size_pass, psnr);
  }

  // Set partition speed feature back.
  cpi->sf.part_sf.partition_search_type = partition_search_type_orig;
  cpi->sf.part_sf.fixed_partition_size = fixed_partition_block_size_orig;

  // Free token related info if screen content coding tools are not enabled.
  if (!cm->features.allow_screen_content_tools)
    free_token_info(&cpi->token_info);
}